

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_sectors.cpp
# Opt level: O1

double __thiscall sector_t::LowestFloorAt(sector_t *this,DVector2 *p,sector_t **resultsec)

{
  uint uVar1;
  subsector_t *psVar2;
  double y;
  double x;
  double dVar3;
  
  x = p->X;
  y = p->Y;
  if ((this->planes[0].Flags & 0x1d0U) == 0x100) {
    dVar3 = 3.4028234663852886e+38;
    do {
      uVar1 = this->Portals[0];
      if (dVar3 < sectorPortals.Array[uVar1].mPlaneZ || dVar3 == sectorPortals.Array[uVar1].mPlaneZ)
      break;
      x = x + sectorPortals.Array[uVar1].mDisplacement.X;
      y = y + sectorPortals.Array[uVar1].mDisplacement.Y;
      dVar3 = sectorPortals.Array[this->Portals[1]].mPlaneZ;
      psVar2 = P_PointInSubsector(x,y);
      this = psVar2->sector;
    } while ((this->planes[0].Flags & 0x1d0U) == 0x100);
  }
  if (resultsec != (sector_t **)0x0) {
    *resultsec = this;
  }
  return (y * (this->floorplane).normal.Y + x * (this->floorplane).normal.X + (this->floorplane).D)
         * (this->floorplane).negiC;
}

Assistant:

double sector_t::LowestFloorAt(const DVector2 &p, sector_t **resultsec)
{
	sector_t *check = this;
	double planeheight = FLT_MAX;
	DVector2 pos = p;

	// Continue until we find a blocking portal or a portal above where we actually are.
	while (!check->PortalBlocksMovement(floor) && planeheight > check->GetPortalPlaneZ(floor))
	{
		pos += check->GetPortalDisplacement(floor);
		planeheight = check->GetPortalPlaneZ(ceiling);
		check = P_PointInSector(pos);
	}
	if (resultsec) *resultsec = check;
	return check->floorplane.ZatPoint(pos);
}